

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

bool __thiscall SortWrap::operator()(SortWrap *this,int a,int b)

{
  CConfig *pCVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ulong *in_RDI;
  code *local_50;
  byte local_31;
  code *local_30;
  
  pCVar1 = CServerBrowserFilter::CServerFilter::Config((CServerFilter *)in_RDI[2]);
  if (pCVar1->m_BrSortOrder == 0) {
    local_50 = (code *)*in_RDI;
    if (((ulong)local_50 & 1) != 0) {
      local_50 = *(code **)(local_50 + *(long *)(in_RDI[2] + in_RDI[1]) + -1);
    }
    local_31 = (*local_50)((long *)(in_RDI[2] + in_RDI[1]),in_ESI,in_EDX);
  }
  else {
    local_30 = (code *)*in_RDI;
    if (((ulong)local_30 & 1) != 0) {
      local_30 = *(code **)(local_30 + *(long *)(in_RDI[2] + in_RDI[1]) + -1);
    }
    local_31 = (*local_30)((long *)(in_RDI[2] + in_RDI[1]),in_EDX,in_ESI);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool operator()(int a, int b) { return (m_pThis->Config()->m_BrSortOrder ? (m_pThis->*m_pfnSort)(b, a) : (m_pThis->*m_pfnSort)(a, b)); }